

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void celero::console::SetConsoleColor(ConsoleColor x)

{
  switch(x) {
  case Red:
    Red();
    return;
  case Red_Bold:
    RedBold();
    return;
  case Green:
    Green();
    return;
  case Green_Bold:
    GreenBold();
    return;
  case Blue:
    Blue();
    return;
  case Blue_Bold:
    BlueBold();
    return;
  case Cyan:
    Cyan();
    return;
  case Cyan_Bold:
    CyanBold();
    return;
  case Yellow:
    Yellow();
    return;
  case Yellow_Bold:
    YellowBold();
    return;
  case White:
    White();
    return;
  case White_Bold:
    WhiteBold();
    return;
  case WhiteOnRed:
    WhiteOnRed();
    return;
  case WhiteOnRed_Bold:
    WhiteOnRedBold();
    return;
  case Purple_Bold:
    PurpleBold();
    return;
  default:
    std::operator<<((ostream *)&std::cout,"\x1b[0m");
    return;
  }
}

Assistant:

void celero::console::SetConsoleColor(const celero::console::ConsoleColor x)
{
	switch(x)
	{
		case console::ConsoleColor::Red:
			Red();
			break;
		case console::ConsoleColor::Red_Bold:
			RedBold();
			break;
		case console::ConsoleColor::Green:
			Green();
			break;
		case console::ConsoleColor::Green_Bold:
			GreenBold();
			break;
		case console::ConsoleColor::Blue:
			Blue();
			break;
		case console::ConsoleColor::Blue_Bold:
			BlueBold();
			break;
		case console::ConsoleColor::Cyan:
			Cyan();
			break;
		case console::ConsoleColor::Cyan_Bold:
			CyanBold();
			break;
		case console::ConsoleColor::Yellow:
			Yellow();
			break;
		case console::ConsoleColor::Yellow_Bold:
			YellowBold();
			break;
		case console::ConsoleColor::White:
			White();
			break;
		case console::ConsoleColor::White_Bold:
			WhiteBold();
			break;
		case console::ConsoleColor::WhiteOnRed:
			WhiteOnRed();
			break;
		case console::ConsoleColor::WhiteOnRed_Bold:
			WhiteOnRedBold();
			break;
		case console::ConsoleColor::Purple_Bold:
			PurpleBold();
			break;
		case console::ConsoleColor::Default:
		default:
			Default();
			break;
	}
}